

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O1

void dePoolArray_selfTest(void)

{
  void **ppvVar1;
  deBool dVar2;
  deMemPool *pool;
  dePoolArray *pdVar3;
  dePoolArray *pdVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  pdVar3 = (dePoolArray *)deMemPool_alloc(pool,0x20);
  pdVar4 = (dePoolArray *)0x0;
  if (pdVar3 != (dePoolArray *)0x0) {
    pdVar3->pool = (deMemPool *)0x0;
    pdVar3->elementSize = 0;
    pdVar3->numElements = 0;
    pdVar3->capacity = 0;
    pdVar3->pageTableCapacity = 0;
    pdVar3->pageTable = (void **)0x0;
    pdVar3->pool = pool;
    pdVar3->elementSize = 4;
    pdVar4 = pdVar3;
  }
  pdVar3 = (dePoolArray *)deMemPool_alloc(pool,0x20);
  iVar7 = 0;
  if (pdVar3 == (dePoolArray *)0x0) {
    pdVar3 = (dePoolArray *)0x0;
  }
  else {
    pdVar3->pool = (deMemPool *)0x0;
    pdVar3->elementSize = 0;
    pdVar3->numElements = 0;
    pdVar3->capacity = 0;
    pdVar3->pageTableCapacity = 0;
    pdVar3->pageTable = (void **)0x0;
    pdVar3->pool = pool;
    pdVar3->elementSize = 2;
    iVar7 = 0;
  }
  do {
    deMemPool_alloc(pool,1);
    iVar6 = pdVar4->numElements + 1;
    if (pdVar4->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar4,iVar6);
      if (dVar2 != 0) goto LAB_00ac34c6;
    }
    else {
LAB_00ac34c6:
      uVar5 = pdVar4->numElements;
      pdVar4->numElements = uVar5 + 1;
      *(int *)((long)pdVar4->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4) = iVar7;
    }
    iVar6 = pdVar3->numElements + 1;
    if (pdVar3->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar3,iVar6);
      if (dVar2 != 0) goto LAB_00ac3500;
    }
    else {
LAB_00ac3500:
      uVar5 = pdVar3->numElements;
      pdVar3->numElements = uVar5 + 1;
      *(short *)((long)pdVar3->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 2) = (short)iVar7
      ;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5000);
  if (pdVar4->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xae);
  }
  if (pdVar3->numElements != 5000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xaf);
  }
  uVar5 = 0;
  do {
    if (uVar5 != *(uint *)((long)pdVar4->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb2);
    }
    if (uVar5 != (int)*(short *)((long)pdVar3->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb3);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5000);
  iVar7 = 4999;
  do {
    uVar5 = pdVar4->numElements - 1;
    pdVar4->numElements = uVar5;
    if (iVar7 != *(int *)((long)pdVar4->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_popBack(arr) == (4999 - i)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb9);
    }
    uVar5 = pdVar3->numElements - 1;
    pdVar3->numElements = uVar5;
    if (iVar7 != *(short *)((long)pdVar3->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_popBack(arr16) == (4999 - i)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xba);
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 3999);
  if (pdVar4->numElements != 4000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 4000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xbd);
  }
  if (pdVar3->numElements != 4000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 4000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xbe);
  }
  uVar5 = 0;
  do {
    if (uVar5 != *(uint *)((long)pdVar4->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xc1);
    }
    if (uVar5 != (int)*(short *)((long)pdVar3->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xc2);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4000);
  if (pdVar4->capacity < 1000) {
    dVar2 = dePoolArray_reserve(pdVar4,1000);
    if (dVar2 != 0) goto LAB_00ac372d;
  }
  else {
LAB_00ac372d:
    pdVar4->numElements = 1000;
  }
  if (pdVar3->capacity < 1000) {
    dVar2 = dePoolArray_reserve(pdVar3,1000);
    if (dVar2 != 0) goto LAB_00ac3750;
  }
  else {
LAB_00ac3750:
    pdVar3->numElements = 1000;
  }
  iVar7 = 1000;
  do {
    iVar6 = pdVar4->numElements + 1;
    if (pdVar4->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar4,iVar6);
      if (dVar2 != 0) goto LAB_00ac3775;
    }
    else {
LAB_00ac3775:
      uVar5 = pdVar4->numElements;
      pdVar4->numElements = uVar5 + 1;
      *(int *)((long)pdVar4->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4) = iVar7;
    }
    iVar6 = pdVar3->numElements + 1;
    if (pdVar3->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar3,iVar6);
      if (dVar2 != 0) goto LAB_00ac37ae;
    }
    else {
LAB_00ac37ae:
      uVar5 = pdVar3->numElements;
      pdVar3->numElements = uVar5 + 1;
      *(short *)((long)pdVar3->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 2) = (short)iVar7
      ;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5000);
  if (pdVar4->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xce);
  }
  if (pdVar3->numElements != 5000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xcf);
  }
  uVar5 = 0;
  do {
    if (uVar5 != *(uint *)((long)pdVar4->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4)) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xd2);
    }
    if (uVar5 != (int)*(short *)((long)pdVar3->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 2)) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xd3);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5000);
  pdVar4 = (dePoolArray *)deMemPool_alloc(pool,0x20);
  if (pdVar4 == (dePoolArray *)0x0) {
    pdVar4 = (dePoolArray *)0x0;
  }
  else {
    pdVar4->pool = (deMemPool *)0x0;
    pdVar4->elementSize = 0;
    pdVar4->numElements = 0;
    pdVar4->capacity = 0;
    pdVar4->pageTableCapacity = 0;
    pdVar4->pageTable = (void **)0x0;
    pdVar4->pool = pool;
    pdVar4->elementSize = 4;
  }
  if (pdVar4->capacity < 0x5dc) {
    dVar2 = dePoolArray_reserve(pdVar4,0x5dc);
    if (dVar2 == 0) goto LAB_00ac38d7;
  }
  pdVar4->numElements = 0x5dc;
LAB_00ac38d7:
  if (pdVar4->capacity < 2000) {
    dePoolArray_reserve(pdVar4,2000);
  }
  ppvVar1 = pdVar4->pageTable;
  uVar5 = 0;
  do {
    *(uint *)((long)ppvVar1[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4) = uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x5dc);
  iVar7 = 0x5dc;
  do {
    iVar6 = pdVar4->numElements + 1;
    if (pdVar4->capacity < iVar6) {
      dVar2 = dePoolArray_reserve(pdVar4,iVar6);
      if (dVar2 != 0) goto LAB_00ac392c;
    }
    else {
LAB_00ac392c:
      uVar5 = pdVar4->numElements;
      pdVar4->numElements = uVar5 + 1;
      *(int *)((long)pdVar4->pageTable[(int)uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4) = iVar7;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 5000) {
      if (pdVar4->numElements != 5000) {
        deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                     ,0xdf);
      }
      uVar5 = 0;
      do {
        if (uVar5 != *(uint *)((long)pdVar4->pageTable[uVar5 >> 4] + (ulong)(uVar5 & 0xf) * 4)) {
          deAssertFail("val == i",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                       ,0xe3);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 5000);
      deMemPool_destroy(pool);
      return;
    }
  } while( true );
}

Assistant:

void dePoolArray_selfTest (void)
{
	deMemPool*			pool	= deMemPool_createRoot(DE_NULL, 0);
	dePoolIntArray*		arr		= dePoolIntArray_create(pool);
	dePoolInt16Array*	arr16	= dePoolInt16Array_create(pool);
	int					i;

	/* Test pushBack(). */
	for (i = 0; i < 5000; i++)
	{
		/* Dummy alloc to try to break alignments. */
		deMemPool_alloc(pool, 1);

		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test popBack(). */
	for (i = 0; i < 1000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_popBack(arr) == (4999 - i));
		DE_TEST_ASSERT(dePoolInt16Array_popBack(arr16) == (4999 - i));
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 4000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 4000);
	for (i = 0; i < 4000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test setSize(). */
	dePoolIntArray_setSize(arr, 1000);
	dePoolInt16Array_setSize(arr16, 1000);
	for (i = 1000; i < 5000; i++)
	{
		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test set() and pushBack() with reserve(). */
	arr = dePoolIntArray_create(pool);
	dePoolIntArray_setSize(arr, 1500);
	dePoolIntArray_reserve(arr, 2000);
	for (i = 0; i < 1500; i++)
		dePoolIntArray_set(arr, i, i);
	for (; i < 5000; i++)
		dePoolIntArray_pushBack(arr, i);

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	for (i = 0; i < 5000; i++)
	{
		int val = dePoolIntArray_get(arr, i);
		DE_TEST_ASSERT(val == i);
	}

	deMemPool_destroy(pool);
}